

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O0

filetime_t __thiscall FileSystemUtils::Path::GetLastWriteTime(Path *this)

{
  int iVar1;
  char *__file;
  undefined1 local_b0 [8];
  stat buffer;
  filetime_t fStack_18;
  int error;
  filetime_t lastwritetime;
  Path *this_local;
  
  fStack_18 = 0;
  buffer.__glibc_reserved[2]._4_4_ = 0xffffffff;
  __file = c_str(this);
  iVar1 = stat(__file,(stat *)local_b0);
  if (iVar1 == 0) {
    fStack_18 = buffer.st_atim.tv_nsec;
  }
  return fStack_18;
}

Assistant:

inline filetime_t Path::GetLastWriteTime()	const
	{
		filetime_t lastwritetime = 0;
		int error = -1;
#ifdef _WIN32
		struct _stat64 buffer;
		std::wstring temp = _Win32Utf8ToUtf16( m_string );
		error = _wstat64( temp.c_str(), &buffer );
#else
		struct stat buffer;
		error = stat( c_str(), &buffer );
#endif
		if( 0 == error )
		{
			lastwritetime = buffer.st_mtime;
		}
		return lastwritetime;
	}